

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O1

QString * __thiscall QMimeData::text(QString *__return_storage_ptr__,QMimeData *this)

{
  QMimeDataPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QMetaType local_80;
  QString local_78;
  QMetaType local_60;
  undefined1 local_58 [24];
  undefined1 *puStack_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (QArrayData *)0x0;
  local_58._8_8_ = L"text/plain;charset=utf-8";
  local_58._16_8_ = (undefined1 *)0x18;
  QMetaType::QMetaType(&local_60,10);
  QMimeDataPrivate::retrieveTypedData((QVariant *)&local_38,this_00,(QString *)local_58,local_60);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  bVar1 = ::QVariant::isNull((QVariant *)&local_38);
  if (bVar1) {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"text/plain";
    local_78.d.size = 10;
    QMetaType::QMetaType(&local_80,10);
    QMimeDataPrivate::retrieveTypedData((QVariant *)local_58,this_00,&local_78,local_80);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)local_58);
    ::QVariant::~QVariant((QVariant *)local_58);
  }
  else {
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_38);
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeData::text() const
{
    Q_D(const QMimeData);
    QVariant utf8Text = d->retrieveTypedData(textPlainUtf8Literal(), QMetaType(QMetaType::QString));
    if (!utf8Text.isNull())
        return utf8Text.toString();

    QVariant data = d->retrieveTypedData(textPlainLiteral(), QMetaType(QMetaType::QString));
    return data.toString();
}